

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O0

void __thiscall Simulator::raiseError(Simulator *this,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [8192];
  undefined1 local_20e8 [16];
  undefined8 local_20d8;
  undefined8 local_20d0;
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined4 local_2038;
  undefined4 local_2034;
  undefined1 *local_2030;
  undefined1 *local_2028;
  char local_2018 [360];
  Simulator *in_stack_ffffffffffffe150;
  
  if (in_AL != '\0') {
    local_20b8 = in_XMM0_Qa;
    local_20a8 = in_XMM1_Qa;
    local_2098 = in_XMM2_Qa;
    local_2088 = in_XMM3_Qa;
    local_2078 = in_XMM4_Qa;
    local_2068 = in_XMM5_Qa;
    local_2058 = in_XMM6_Qa;
    local_2048 = in_XMM7_Qa;
  }
  local_2028 = local_20e8;
  local_2030 = &stack0x00000008;
  local_2034 = 0x30;
  local_2038 = 0x10;
  local_20d8 = in_RDX;
  local_20d0 = in_RCX;
  local_20c8 = in_R8;
  local_20c0 = in_R9;
  vsprintf(local_2018,in_RSI,&local_2038);
  fprintf(_stderr,"%s",local_2018);
  dumpHistory(in_stack_ffffffffffffe150);
  fprintf(_stderr,"Error! Please check dump.txt\n");
  exit(-1);
}

Assistant:

void Simulator::raiseError(const char *format, ...) {
    char buf[BUFSIZ];
    va_list args;
    va_start(args, format);
    vsprintf(buf, format, args);
    fprintf(stderr, "%s", buf);
    va_end(args);
    dumpHistory();
    fprintf(stderr, "Error! Please check dump.txt\n");
    exit(-1);
}